

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

int main(int argc,char **argv)

{
  pointer __x;
  pointer pcVar1;
  pointer pGVar2;
  pointer ptVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  Geometry_t geometry;
  topology_object_t topology;
  Polygon_topojson_t polygon;
  topojson_t topojson;
  Geometry_t local_148;
  long *local_110 [2];
  long local_100 [2];
  vector<Geometry_t,_std::allocator<Geometry_t>_> local_f0;
  ulong local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  topojson_t local_88;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"usage : ./parser <GEOJSON file>",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    iVar5 = 1;
  }
  else {
    local_88.translate[0] = 0.0;
    local_88.translate[1] = 0.0;
    local_88.scale[0] = 0.0;
    local_88.scale[1] = 0.0;
    local_88.m_arcs.super__Vector_base<arc_t,_std::allocator<arc_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.m_arcs.super__Vector_base<arc_t,_std::allocator<arc_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.m_topology.super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.m_arcs.super__Vector_base<arc_t,_std::allocator<arc_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.m_topology.super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.m_topology.super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.idx_geom = 0;
    iVar5 = topojson_t::convert(&local_88,argv[1]);
    if (iVar5 < 0) {
      iVar5 = 1;
    }
    else {
      if (local_88.m_topology.
          super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_88.m_topology.
          super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl.
          super__Vector_impl_data._M_start) {
        topojson_t::make_coordinates(&local_88,0);
        ptVar3 = local_88.m_topology.
                 super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = (long)local_88.m_topology.
                      super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_88.m_topology.
                      super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar6 == 0) {
LAB_00108d6d:
          uVar8 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0,(lVar6 >> 3) * 0x6db6db6db6db6db7);
          if (local_110[0] != local_100) {
            operator_delete(local_110[0],local_100[0] + 1);
          }
          std::vector<arc_t,_std::allocator<arc_t>_>::~vector(&local_88.m_arcs);
          std::vector<topology_object_t,_std::allocator<topology_object_t>_>::~vector
                    (&local_88.m_topology);
          _Unwind_Resume(uVar8);
        }
        local_110[0] = local_100;
        pcVar1 = ((local_88.m_topology.
                   super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl
                   .super__Vector_impl_data._M_start)->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_110,pcVar1,
                   pcVar1 + ((local_88.m_topology.
                              super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)->name)._M_string_length);
        std::vector<Geometry_t,_std::allocator<Geometry_t>_>::vector(&local_f0,&ptVar3->m_geom);
        if ((long)local_f0.super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_f0.super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar6 = ((long)local_f0.super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_f0.super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
          local_d8 = lVar6 + (ulong)(lVar6 == 0);
          uVar12 = 0;
          do {
            pGVar2 = local_f0.super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar9 = ((long)local_f0.super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_f0.super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
            if (uVar9 < uVar12 || uVar9 - uVar12 == 0) {
LAB_00108d5c:
              lVar6 = std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar12);
              goto LAB_00108d6d;
            }
            pcVar1 = local_f0.super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12].type._M_dataplus._M_p;
            local_148.type._M_dataplus._M_p = (pointer)&local_148.type.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_148,pcVar1,
                       pcVar1 + local_f0.super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar12].type.
                                _M_string_length);
            std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::vector
                      (&local_148.m_polygon,&pGVar2[uVar12].m_polygon);
            bVar4 = is_polygon(&local_148);
            if ((bVar4) &&
               ((long)local_148.m_polygon.
                      super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_148.m_polygon.
                      super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                      _M_impl.super__Vector_impl_data._M_start != 0)) {
              lVar6 = ((long)local_148.m_polygon.
                             super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_148.m_polygon.
                             super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
              uVar9 = 0;
              do {
                uVar10 = ((long)local_148.m_polygon.
                                super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_148.m_polygon.
                                super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x71c71c71c71c71c7;
                if (uVar10 < uVar9 || uVar10 - uVar9 == 0) {
LAB_00108d3a:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar9);
LAB_00108d4b:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar9);
                  goto LAB_00108d5c;
                }
                __x = local_148.m_polygon.
                      super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar9;
                std::vector<int,_std::allocator<int>_>::vector(&local_d0,&__x->arcs);
                std::vector<double,_std::allocator<double>_>::vector(&local_b8,&__x->m_x);
                std::vector<double,_std::allocator<double>_>::vector(&local_a0,&__x->m_y);
                uVar10 = ((long)local_148.m_polygon.
                                super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_148.m_polygon.
                                super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x71c71c71c71c71c7;
                if (uVar10 < uVar9 || uVar10 - uVar9 == 0) goto LAB_00108d4b;
                lVar7 = (long)local_148.m_polygon.
                              super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar9].m_y.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_148.m_polygon.
                              super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar9].m_y.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
                if (lVar7 != 0) {
                  lVar7 = lVar7 >> 3;
                  lVar11 = 0;
                  do {
                    if ((long)local_148.m_polygon.
                              super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar9].m_x.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_148.m_polygon.
                              super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar9].m_x.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3 == lVar11) {
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
                      goto LAB_00108d3a;
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar7 + (ulong)(lVar7 == 0) != lVar11);
                }
                if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_a0.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_a0.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_b8.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_b8.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_d0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_d0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != lVar6 + (ulong)(lVar6 == 0));
            }
            std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::~vector
                      (&local_148.m_polygon);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148.type._M_dataplus._M_p != &local_148.type.field_2) {
              operator_delete(local_148.type._M_dataplus._M_p,
                              local_148.type.field_2._M_allocated_capacity + 1);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != local_d8);
        }
        std::vector<Geometry_t,_std::allocator<Geometry_t>_>::~vector(&local_f0);
        if (local_110[0] != local_100) {
          operator_delete(local_110[0],local_100[0] + 1);
        }
      }
      iVar5 = 0;
    }
    std::vector<arc_t,_std::allocator<arc_t>_>::~vector(&local_88.m_arcs);
    std::vector<topology_object_t,_std::allocator<topology_object_t>_>::~vector
              (&local_88.m_topology);
  }
  return iVar5;
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc < 2)
  {
    std::cout << "usage : ./parser <GEOJSON file>" << std::endl;
    return 1;
  }

  topojson_t topojson;
  if (topojson.convert(argv[1]) < 0)
  {
    return 1;
  }

  //no objects
  if (!topojson.m_topology.size())
  {
    return 0;
  }

  /////////////////////////////////////////////////////////////////////////////////////////////////////
  //must make the coordinates for the topology first; assume the first topology
  /////////////////////////////////////////////////////////////////////////////////////////////////////

  size_t topology_index = 0;
  topojson.make_coordinates(topology_index);
  topology_object_t topology = topojson.m_topology.at(topology_index);

  size_t size_geom = topology.m_geom.size();
  for (size_t idx_geom = 0; idx_geom < size_geom; idx_geom++)
  {
    Geometry_t geometry = topology.m_geom.at(idx_geom);
    if (is_polygon(geometry))
    {
      size_t size_pol = geometry.m_polygon.size();
      for (size_t idx_pol = 0; idx_pol < size_pol; idx_pol++)
      {
        Polygon_topojson_t polygon = geometry.m_polygon.at(idx_pol);

        //render

        size_t size_points = geometry.m_polygon.at(idx_pol).m_y.size();
        for (size_t idx_crd = 0; idx_crd < size_points; idx_crd++)
        {
          double lat = geometry.m_polygon.at(idx_pol).m_y.at(idx_crd);
          double lon = geometry.m_polygon.at(idx_pol).m_x.at(idx_crd);
        }

      }
    }
  }

  return 0;
}